

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O0

expr_node * __thiscall expr_tree::tanDeriv(expr_tree *this,expr_node *node)

{
  expr_node *peVar1;
  expr_node *peVar2;
  expr_node *square;
  expr_node *deriv;
  expr_value local_58;
  expr_value local_50;
  expr_node *local_48;
  expr_value local_40;
  expr_value local_38 [3];
  expr_value local_20;
  expr_node *local_18;
  
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)&local_20,4);
  expr_node::expr_node(peVar1,'\x05',&local_20);
  local_18 = peVar1;
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)local_38,1);
  expr_node::expr_node(peVar1,'\x01',local_38);
  local_18->left = peVar1;
  peVar2 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)&local_40,5);
  expr_node::expr_node(peVar2,'\x05',&local_40);
  local_18->right = peVar2;
  local_48 = local_18->right;
  peVar2 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)&local_50,10);
  expr_node::expr_node(peVar2,'\x05',&local_50);
  local_48->left = peVar2;
  peVar1 = Copy(peVar1);
  local_48->left->right = peVar1;
  Link(local_48->left,(expr_node *)0x0,local_48->left->right);
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)&local_58,2);
  expr_node::expr_node(peVar1,'\x01',&local_58);
  local_48->right = peVar1;
  Link(local_48,local_48->left,local_48->right);
  Link(local_18,local_18->left,local_18->right);
  return local_18;
}

Assistant:

expr_node* expr_tree::tanDeriv(const expr_node* node)
{
    auto deriv = new expr_node(OP, (long)DIV);
    deriv->left = new expr_node(INT, (long)1);
    deriv->right = new expr_node(OP, (long)PWR);
    auto square = deriv->right;
    square->left = new expr_node(OP, (long)COS);
    square->left->right = Copy(node->right);
    Link(square->left, nullptr, square->left->right);
    square->right = new expr_node(INT, (long)2);
    Link(square, square->left, square->right);
    Link(deriv, deriv->left, deriv->right);
    return deriv;
}